

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::SwapFieldHelper::SwapRepeatedStringField<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  CppStringType CVar4;
  RepeatedField<absl::lts_20250127::Cord> *this;
  RepeatedField<absl::lts_20250127::Cord> *other;
  undefined8 *puVar5;
  undefined8 *puVar6;
  SwapFieldHelper local_30 [16];
  
  CVar4 = FieldDescriptor::cpp_string_type(field);
  if ((CVar4 == kView) || (CVar4 == kString)) {
    Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
    puVar5 = (undefined8 *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
    puVar6 = (undefined8 *)Reflection::MutableRawImpl(r,rhs,field);
    if (puVar5 == puVar6) {
      SwapRepeatedStringField<true>(local_30);
    }
    uVar1 = *puVar5;
    uVar2 = puVar5[1];
    uVar3 = puVar6[1];
    *puVar5 = *puVar6;
    puVar5[1] = uVar3;
    *puVar6 = uVar1;
    puVar6[1] = uVar2;
  }
  else if (CVar4 == kCord) {
    Reflection::VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(r,field);
    this = (RepeatedField<absl::lts_20250127::Cord> *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(r,field);
    other = (RepeatedField<absl::lts_20250127::Cord> *)Reflection::MutableRawImpl(r,rhs,field);
    RepeatedField<absl::lts_20250127::Cord>::InternalSwap(this,other);
    return;
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapRepeatedStringField(const Reflection* r, Message* lhs,
                                              Message* rhs,
                                              const FieldDescriptor* field) {
  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      auto* lhs_cord = r->MutableRaw<RepeatedField<absl::Cord>>(lhs, field);
      auto* rhs_cord = r->MutableRaw<RepeatedField<absl::Cord>>(rhs, field);
      if (unsafe_shallow_swap) {
        lhs_cord->InternalSwap(rhs_cord);
      } else {
        lhs_cord->Swap(rhs_cord);
      }
      break;
    }
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString: {
      auto* lhs_string = r->MutableRaw<RepeatedPtrFieldBase>(lhs, field);
      auto* rhs_string = r->MutableRaw<RepeatedPtrFieldBase>(rhs, field);
      if (unsafe_shallow_swap) {
        lhs_string->InternalSwap(rhs_string);
      } else {
        lhs_string->Swap<GenericTypeHandler<std::string>>(rhs_string);
      }
      break;
    }
  }
}